

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLPIERCING_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_000001a8;
  double *in_stack_000001b0;
  double *in_stack_000001b8;
  double *in_stack_000001c0;
  int in_stack_000001cc;
  int in_stack_000001d0;
  int *in_stack_000001e0;
  int *in_stack_000001e8;
  int *in_stack_000001f0;
  
  TVar1 = TA_CDLPIERCING(in_stack_000001d0,in_stack_000001cc,in_stack_000001c0,in_stack_000001b8,
                         in_stack_000001b0,in_stack_000001a8,in_stack_000001e0,in_stack_000001e8,
                         in_stack_000001f0);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLPIERCING_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLPIERCING(
/* Generated */                     startIdx,
/* Generated */                     endIdx,
/* Generated */                     params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                     params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                     params->in[0].data.inPrice.low, /* inLow */
/* Generated */                     params->in[0].data.inPrice.close, /* inClose */
/* Generated */                     outBegIdx, 
/* Generated */                     outNBElement, 
/* Generated */                     params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }